

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_decode_v2(opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                      opj_event_mgr_t *p_manager)

{
  uint uVar1;
  opj_image_comp_t *poVar2;
  opj_image_comp_t *poVar3;
  opj_bool oVar4;
  opj_image_t *p_image_dest;
  opj_bool oVar5;
  long lVar6;
  
  oVar5 = 0;
  if (p_image != (opj_image_t *)0x0) {
    p_image_dest = opj_image_create0();
    p_j2k->m_output_image = p_image_dest;
    oVar5 = 0;
    if (p_image_dest != (opj_image_t *)0x0) {
      opj_copy_image_header(p_image,p_image_dest);
      opj_procedure_list_add_procedure(p_j2k->m_procedure_list,j2k_decode_tiles);
      oVar4 = j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (oVar4 == 0) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = (opj_image_t *)0x0;
      }
      else {
        uVar1 = p_image->numcomps;
        oVar5 = 1;
        if ((ulong)uVar1 != 0) {
          poVar2 = p_j2k->m_output_image->comps;
          poVar3 = p_image->comps;
          lVar6 = 0;
          do {
            *(undefined4 *)((long)&poVar3->resno_decoded + lVar6) =
                 *(undefined4 *)((long)&poVar2->resno_decoded + lVar6);
            *(undefined8 *)((long)&poVar3->data + lVar6) =
                 *(undefined8 *)((long)&poVar2->data + lVar6);
            *(undefined8 *)((long)&poVar2->data + lVar6) = 0;
            lVar6 = lVar6 + 0x38;
          } while ((ulong)uVar1 * 0x38 - lVar6 != 0);
        }
      }
    }
  }
  return oVar5;
}

Assistant:

opj_bool j2k_decode_v2(	opj_j2k_v2_t * p_j2k,
						opj_stream_private_t * p_stream,
						opj_image_t * p_image,
						opj_event_mgr_t * p_manager)
{
	OPJ_UINT32 compno;

	if (!p_image)
		return OPJ_FALSE;

	p_j2k->m_output_image = opj_image_create0();
	if (! (p_j2k->m_output_image)) {
		return OPJ_FALSE;
	}
	opj_copy_image_header(p_image, p_j2k->m_output_image);

	/* customization of the decoding */
	j2k_setup_decoding(p_j2k);

	/* Decode the codestream */
	if (! j2k_exec (p_j2k,p_j2k->m_procedure_list,p_stream,p_manager)) {
		opj_image_destroy(p_j2k->m_private_image);
		p_j2k->m_private_image = NULL;
		return OPJ_FALSE;
	}

	/* Move data and copy one information from codec to output image*/
	for (compno = 0; compno < p_image->numcomps; compno++) {
		p_image->comps[compno].resno_decoded = p_j2k->m_output_image->comps[compno].resno_decoded;
		p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
		p_j2k->m_output_image->comps[compno].data = NULL;
	}

	return OPJ_TRUE;
}